

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impl_simd.h
# Opt level: O2

void __thiscall ImplSimd<SimdAVX>::RGB2YUV(ImplSimd<SimdAVX> *this,RGB *rgb,YUV420 *yuv)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  uint8_t *puVar7;
  uint8_t *puVar8;
  uint8_t *puVar9;
  uint8_t *puVar10;
  uint8_t *puVar11;
  uint8_t *puVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  uint __line;
  char *__assertion;
  size_t i;
  ulong uVar15;
  ulong uVar16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  
  if (yuv->height_ == rgb->height_) {
    if (yuv->width_ == rgb->width_) {
      uVar16 = yuv->size_;
      if ((uVar16 & 0xf) == 0) {
        puVar7 = yuv->y_;
        puVar8 = yuv->u_;
        puVar9 = yuv->v_;
        puVar10 = rgb->r_;
        puVar11 = rgb->g_;
        puVar12 = rgb->b_;
        auVar17._8_2_ = 0x42;
        auVar17._0_8_ = 0x42004200420042;
        auVar17._10_2_ = 0x42;
        auVar17._12_2_ = 0x42;
        auVar17._14_2_ = 0x42;
        auVar17._16_2_ = 0x42;
        auVar17._18_2_ = 0x42;
        auVar17._20_2_ = 0x42;
        auVar17._22_2_ = 0x42;
        auVar17._24_2_ = 0x42;
        auVar17._26_2_ = 0x42;
        auVar17._28_2_ = 0x42;
        auVar17._30_2_ = 0x42;
        auVar18._8_2_ = 0x81;
        auVar18._0_8_ = 0x81008100810081;
        auVar18._10_2_ = 0x81;
        auVar18._12_2_ = 0x81;
        auVar18._14_2_ = 0x81;
        auVar18._16_2_ = 0x81;
        auVar18._18_2_ = 0x81;
        auVar18._20_2_ = 0x81;
        auVar18._22_2_ = 0x81;
        auVar18._24_2_ = 0x81;
        auVar18._26_2_ = 0x81;
        auVar18._28_2_ = 0x81;
        auVar18._30_2_ = 0x81;
        auVar19._8_2_ = 0x19;
        auVar19._0_8_ = 0x19001900190019;
        auVar19._10_2_ = 0x19;
        auVar19._12_2_ = 0x19;
        auVar19._14_2_ = 0x19;
        auVar19._16_2_ = 0x19;
        auVar19._18_2_ = 0x19;
        auVar19._20_2_ = 0x19;
        auVar19._22_2_ = 0x19;
        auVar19._24_2_ = 0x19;
        auVar19._26_2_ = 0x19;
        auVar19._28_2_ = 0x19;
        auVar19._30_2_ = 0x19;
        auVar20._8_2_ = 0x80;
        auVar20._0_8_ = 0x80008000800080;
        auVar20._10_2_ = 0x80;
        auVar20._12_2_ = 0x80;
        auVar20._14_2_ = 0x80;
        auVar20._16_2_ = 0x80;
        auVar20._18_2_ = 0x80;
        auVar20._20_2_ = 0x80;
        auVar20._22_2_ = 0x80;
        auVar20._24_2_ = 0x80;
        auVar20._26_2_ = 0x80;
        auVar20._28_2_ = 0x80;
        auVar20._30_2_ = 0x80;
        auVar21._8_2_ = 0x10;
        auVar21._0_8_ = 0x10001000100010;
        auVar21._10_2_ = 0x10;
        auVar21._12_2_ = 0x10;
        auVar21._14_2_ = 0x10;
        auVar21._16_2_ = 0x10;
        auVar21._18_2_ = 0x10;
        auVar21._20_2_ = 0x10;
        auVar21._22_2_ = 0x10;
        auVar21._24_2_ = 0x10;
        auVar21._26_2_ = 0x10;
        auVar21._28_2_ = 0x10;
        auVar21._30_2_ = 0x10;
        auVar22._8_2_ = 0x70;
        auVar22._0_8_ = 0x70007000700070;
        auVar22._10_2_ = 0x70;
        auVar22._12_2_ = 0x70;
        auVar22._14_2_ = 0x70;
        auVar22._16_2_ = 0x70;
        auVar22._18_2_ = 0x70;
        auVar22._20_2_ = 0x70;
        auVar22._22_2_ = 0x70;
        auVar22._24_2_ = 0x70;
        auVar22._26_2_ = 0x70;
        auVar22._28_2_ = 0x70;
        auVar22._30_2_ = 0x70;
        auVar23._8_2_ = 0xffda;
        auVar23._0_8_ = 0xffdaffdaffdaffda;
        auVar23._10_2_ = 0xffda;
        auVar23._12_2_ = 0xffda;
        auVar23._14_2_ = 0xffda;
        auVar23._16_2_ = 0xffda;
        auVar23._18_2_ = 0xffda;
        auVar23._20_2_ = 0xffda;
        auVar23._22_2_ = 0xffda;
        auVar23._24_2_ = 0xffda;
        auVar23._26_2_ = 0xffda;
        auVar23._28_2_ = 0xffda;
        auVar23._30_2_ = 0xffda;
        auVar24._8_2_ = 0xffb6;
        auVar24._0_8_ = 0xffb6ffb6ffb6ffb6;
        auVar24._10_2_ = 0xffb6;
        auVar24._12_2_ = 0xffb6;
        auVar24._14_2_ = 0xffb6;
        auVar24._16_2_ = 0xffb6;
        auVar24._18_2_ = 0xffb6;
        auVar24._20_2_ = 0xffb6;
        auVar24._22_2_ = 0xffb6;
        auVar24._24_2_ = 0xffb6;
        auVar24._26_2_ = 0xffb6;
        auVar24._28_2_ = 0xffb6;
        auVar24._30_2_ = 0xffb6;
        auVar25._8_2_ = 0xffa2;
        auVar25._0_8_ = 0xffa2ffa2ffa2ffa2;
        auVar25._10_2_ = 0xffa2;
        auVar25._12_2_ = 0xffa2;
        auVar25._14_2_ = 0xffa2;
        auVar25._16_2_ = 0xffa2;
        auVar25._18_2_ = 0xffa2;
        auVar25._20_2_ = 0xffa2;
        auVar25._22_2_ = 0xffa2;
        auVar25._24_2_ = 0xffa2;
        auVar25._26_2_ = 0xffa2;
        auVar25._28_2_ = 0xffa2;
        auVar25._30_2_ = 0xffa2;
        auVar26._8_2_ = 0xffee;
        auVar26._0_8_ = 0xffeeffeeffeeffee;
        auVar26._10_2_ = 0xffee;
        auVar26._12_2_ = 0xffee;
        auVar26._14_2_ = 0xffee;
        auVar26._16_2_ = 0xffee;
        auVar26._18_2_ = 0xffee;
        auVar26._20_2_ = 0xffee;
        auVar26._22_2_ = 0xffee;
        auVar26._24_2_ = 0xffee;
        auVar26._26_2_ = 0xffee;
        auVar26._28_2_ = 0xffee;
        auVar26._30_2_ = 0xffee;
        for (uVar15 = 0; uVar15 < uVar16; uVar15 = uVar15 + 0x10) {
          auVar1._8_8_ = 0;
          auVar1._0_8_ = *(ulong *)(puVar10 + uVar15);
          auVar1 = vpmovzxbw_avx(auVar1);
          auVar2._8_8_ = 0;
          auVar2._0_8_ = *(ulong *)(puVar10 + uVar15 + 8);
          auVar2 = vpmovzxbw_avx(auVar2);
          auVar3._8_8_ = 0;
          auVar3._0_8_ = *(ulong *)(puVar11 + uVar15);
          auVar3 = vpmovzxbw_avx(auVar3);
          auVar27._0_16_ = ZEXT116(0) * auVar2 + ZEXT116(1) * auVar1;
          auVar27._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar2;
          auVar4._8_8_ = 0;
          auVar4._0_8_ = *(ulong *)(puVar11 + uVar15 + 8);
          auVar1 = vpmovzxbw_avx(auVar4);
          auVar28._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar3;
          auVar28._16_16_ = ZEXT116(1) * auVar1;
          auVar5._8_8_ = 0;
          auVar5._0_8_ = *(ulong *)(puVar12 + uVar15);
          auVar1 = vpmovzxbw_avx(auVar5);
          auVar6._8_8_ = 0;
          auVar6._0_8_ = *(ulong *)(puVar12 + uVar15 + 8);
          auVar2 = vpmovzxbw_avx(auVar6);
          auVar29._0_16_ = ZEXT116(0) * auVar2 + ZEXT116(1) * auVar1;
          auVar29._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar2;
          auVar30 = vpmullw_avx2(auVar27,auVar17);
          auVar13 = vpmullw_avx2(auVar28,auVar18);
          auVar30 = vpaddw_avx2(auVar30,auVar13);
          auVar13 = vpmullw_avx2(auVar29,auVar19);
          auVar13 = vpaddw_avx2(auVar13,auVar20);
          auVar30 = vpaddw_avx2(auVar30,auVar13);
          auVar30 = vpsraw_avx2(auVar30,8);
          auVar30 = vpaddw_avx2(auVar30,auVar21);
          auVar1 = vpacksswb_avx(auVar30._0_16_,auVar30._16_16_);
          *(undefined1 (*) [16])(puVar7 + uVar15) = auVar1;
          auVar13 = vpmullw_avx2(auVar29,auVar22);
          auVar30 = vpmullw_avx2(auVar27,auVar23);
          auVar14 = vpmullw_avx2(auVar28,auVar24);
          auVar30 = vpaddw_avx2(auVar30,auVar14);
          auVar13 = vpaddw_avx2(auVar13,auVar20);
          auVar30 = vpaddw_avx2(auVar30,auVar13);
          auVar30 = vpsraw_avx2(auVar30,8);
          auVar30 = vpaddw_avx2(auVar30,auVar20);
          auVar1 = vpacksswb_avx(auVar30._0_16_,auVar30._16_16_);
          *(undefined1 (*) [16])(puVar8 + uVar15) = auVar1;
          auVar30 = vpmullw_avx2(auVar27,auVar22);
          auVar13 = vpmullw_avx2(auVar28,auVar25);
          auVar30 = vpaddw_avx2(auVar30,auVar13);
          auVar13 = vpmullw_avx2(auVar29,auVar26);
          auVar13 = vpaddw_avx2(auVar13,auVar20);
          auVar30 = vpaddw_avx2(auVar30,auVar13);
          auVar30 = vpsraw_avx2(auVar30,8);
          auVar30 = vpaddw_avx2(auVar30,auVar20);
          auVar1 = vpacksswb_avx(auVar30._0_16_,auVar30._16_16_);
          *(undefined1 (*) [16])(puVar9 + uVar15) = auVar1;
          uVar16 = yuv->size_;
        }
        return;
      }
      __assertion = "yuv->size_ % kStride == 0";
      __line = 0x3f;
    }
    else {
      __assertion = "yuv->width_ == rgb->width_";
      __line = 0x3e;
    }
  }
  else {
    __assertion = "yuv->height_ == rgb->height_";
    __line = 0x3d;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/magic3007[P]intel-simd/impl_simd.h"
                ,__line,"virtual void ImplSimd<SimdAVX>::RGB2YUV(RGB *, YUV420 *) [SIMD = SimdAVX]")
  ;
}

Assistant:

void ImplSimd<SIMD>::RGB2YUV(RGB *rgb, YUV420 *yuv) {
  assert(yuv->height_ == rgb->height_);
  assert(yuv->width_ == rgb->width_);
  assert(yuv->size_ % kStride == 0);

  auto y = yuv->y_;
  auto u = yuv->u_;
  auto v = yuv->v_;
  auto r = rgb->r_;
  auto g = rgb->g_;
  auto b = rgb->b_;

  for(size_t i = 0; i < yuv->size_; i += kStride){
    Vector c = load(r+i);
    Vector d = load(g+i);
    Vector e = load(b+i);

    /*
    y[i] = clamp(((66 * c + 129 * d + 25 * e + 128) >> 8) + 16);
    u[i] = clamp(((-38 * c - 74 * d + 112 * e + 128) >> 8) + 128);
    v[i] = clamp(((112 * c - 94 * d - 18 * e + 128) >> 8) + 128);
     */
    store(add(rli(add(add(add(mul(cn(66),c), mul(cn(129), d)), mul(cn(25), e)), cn(128)),8), cn(16)), y+i);
    store(add(rli(add(sub(sub(mul(cn(112),e), mul(cn(38), c)), mul(cn(74), d)), cn(128)),8), cn(128)), u+i);
    store(add(rli(add(sub(sub(mul(cn(112),c), mul(cn(94), d)), mul(cn(18), e)), cn(128)),8), cn(128)), v+i);
    SIMD::Empty();
  }

}